

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O0

attr_list INT_CMtest_transport(CMConnection conn,attr_list how)

{
  long lVar1;
  int iVar2;
  __pid_t _Var3;
  char *__s;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  pthread_t pVar7;
  undefined8 in_RSI;
  long *in_RDI;
  timespec ts_3;
  timespec ts_2;
  int ret;
  int j;
  size_t each;
  timespec ts_1;
  timespec ts;
  char *attr_str;
  int node_id;
  _free_struct *write_data;
  CManager cm;
  long count;
  long start_size;
  int reuse_write_buffer;
  int repeat_count;
  int verbose;
  int vecs;
  ssize_t size;
  int header [6];
  FFSEncodeVec *header_vec;
  FFSEncodeVec *tmp_vec;
  FFSEncodeVec *write_vec;
  long actual;
  attr_list result;
  int cond;
  int i;
  code *in_stack_fffffffffffffeb0;
  CMConnection in_stack_fffffffffffffeb8;
  CManager in_stack_fffffffffffffec0;
  FILE *pFVar8;
  long in_stack_fffffffffffffec8;
  FFSEncodeVector in_stack_fffffffffffffed0;
  CManager in_stack_fffffffffffffed8;
  CMConnection in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  CMTraceType trace_type;
  CManager in_stack_fffffffffffffef0;
  timespec local_100;
  timespec local_f0;
  int local_e0;
  int local_dc;
  long local_d8;
  timespec local_d0;
  CMConnection in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CMConnection conn_00;
  long local_90;
  int iVar9;
  uint local_7c;
  undefined4 uVar10;
  uint uVar11;
  undefined1 *in_stack_ffffffffffffff90;
  undefined4 local_68;
  uint local_64;
  int local_60;
  int local_5c;
  undefined4 local_58;
  undefined4 local_54;
  long *local_48;
  long *local_40;
  transport_entry_conflict local_38;
  long local_30;
  attr_list local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  long *local_10;
  attr_list local_8;
  
  local_28 = (attr_list)0x0;
  uVar11 = 1;
  uVar10 = 0;
  local_7c = 1;
  iVar9 = 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  init_atoms();
  local_20 = INT_CMCondition_get(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  conn_00 = (CMConnection)*local_10;
  iVar2 = get_long_attr(local_18,CM_TRANS_TEST_SIZE,&stack0xffffffffffffff90);
  if (iVar2 == 0) {
    printf("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required\n");
    local_8 = (attr_list)0x0;
  }
  else {
    get_int_attr(local_18,CM_TRANS_TEST_VECS,&stack0xffffffffffffff8c);
    if ((int)uVar11 < 1) {
      printf("Stupid vecs value in CMtest_transport, %d\n",(ulong)uVar11);
      local_8 = (attr_list)0x0;
    }
    else {
      if (((float)(long)in_stack_ffffffffffffff90 / (float)(int)uVar11 < 24.0) &&
         (uVar11 = 1, (long)in_stack_ffffffffffffff90 < 0x18)) {
        in_stack_ffffffffffffff90 = &DAT_00000018;
      }
      get_int_attr(local_18,CM_TRANS_TEST_VERBOSE,&stack0xffffffffffffff88);
      get_int_attr(local_18,CM_TRANS_TEST_REPEAT,&local_7c);
      get_int_attr(local_18,CM_TRANS_TEST_REUSE_WRITE_BUFFER,&stack0xffffffffffffff80);
      get_int_attr(local_18,CM_TRANS_TEST_NODE,&stack0xffffffffffffff5c);
      __s = (char *)attr_list_to_string(local_18);
      sVar4 = strlen(__s);
      local_60 = (int)sVar4 + 0x19;
      local_68 = 0x434d5000;
      local_64 = local_60 >> 0x1f & 0xffffffU | 0xfa000000;
      local_5c = local_20;
      local_58 = 0x18;
      local_54 = 0;
      INT_CMCondition_set_client_data
                (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 in_stack_fffffffffffffeb0);
      iVar2 = CMtrace_val[5];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar2 = CMtrace_init(in_stack_fffffffffffffef0,
                             (CMTraceType)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_fffffffffffffef0 = *(CManager *)(*local_10 + 0x120);
          _Var3 = getpid();
          pVar7 = pthread_self();
          fprintf((FILE *)in_stack_fffffffffffffef0,"P%lxT%lx - ",(long)_Var3,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&stack0xffffffffffffff40);
          fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff40,
                  in_stack_ffffffffffffff48);
        }
        fprintf(*(FILE **)(*local_10 + 0x120),
                "CM - Initiating transport test of %zd bytes, %d messages\n",
                in_stack_ffffffffffffff90,(ulong)local_7c);
      }
      fflush(*(FILE **)(*local_10 + 0x120));
      iVar2 = CMtrace_val[5];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar2 = CMtrace_init(in_stack_fffffffffffffef0,
                             (CMTraceType)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_fffffffffffffee0 = *(CMConnection *)(*local_10 + 0x120);
          _Var3 = getpid();
          in_stack_fffffffffffffee8 = (long)_Var3;
          pVar7 = pthread_self();
          fprintf((FILE *)in_stack_fffffffffffffee0,"P%lxT%lx - ",in_stack_fffffffffffffee8,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_d0);
          fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_d0.tv_sec,local_d0.tv_nsec);
        }
        fprintf(*(FILE **)(*local_10 + 0x120),"CM - transport test, sending first message\n");
      }
      fflush(*(FILE **)(*local_10 + 0x120));
      local_48 = (long *)INT_CMmalloc((size_t)in_stack_fffffffffffffeb0);
      *local_48 = (long)&local_68;
      local_48[1] = 0x18;
      local_48[2] = (long)__s;
      sVar4 = strlen(__s);
      local_48[3] = sVar4 + 1;
      iVar2 = INT_CMwrite_raw(in_stack_fffffffffffffee0,(FFSEncodeVector)in_stack_fffffffffffffed8,
                              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                              (size_t)in_stack_fffffffffffffec0,(attr_list)in_stack_fffffffffffffeb8
                              ,(int)in_stack_fffffffffffffef0);
      local_30 = (long)iVar2;
      free(__s);
      if (local_30 == 1) {
        local_40 = (long *)0x0;
        local_d8 = (long)(in_stack_ffffffffffffff90 + (long)(int)uVar11 + -1) / (long)(int)uVar11;
        for (local_1c = 0; trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffee8 >> 0x20),
            local_1c < (int)local_7c; local_1c = local_1c + 1) {
          if (local_40 == (long *)0x0) {
            local_40 = (long *)INT_CMmalloc((size_t)in_stack_fffffffffffffeb0);
            local_40[1] = 0x14;
            for (local_90 = 0; local_90 < (int)uVar11; local_90 = local_90 + 1) {
              pvVar5 = calloc(local_d8 + (int)local_7c,1);
              local_40[(local_90 + 1) * 2] = (long)pvVar5;
              local_40[(local_90 + 1) * 2 + 1] = local_d8;
            }
            for (local_90 = 0; local_90 < (int)uVar11; local_90 = local_90 + 1) {
              for (local_dc = 0; (ulong)(long)local_dc < (ulong)(local_d8 + (int)local_7c) >> 2;
                  local_dc = local_dc + 1) {
                iVar2 = rand();
                *(int *)(local_40[(local_90 + 1) * 2] + (long)local_dc * 4) = iVar2;
              }
            }
            if ((ulong)local_40[1] < (ulong)local_40[3]) {
              local_40[3] = local_40[3] - local_40[1];
            }
            else {
              local_40[3] = 1;
            }
          }
          pvVar5 = INT_CMmalloc((size_t)in_stack_fffffffffffffeb0);
          *local_40 = (long)pvVar5;
          *(undefined4 *)*local_40 = 0x434d5000;
          *(uint *)(*local_40 + 4) =
               (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20) & 0xffffff | 0xfb000000;
          *(int *)(*local_40 + 8) = (int)in_stack_ffffffffffffff90;
          *(int *)(*local_40 + 0xc) = local_1c;
          *(undefined4 *)(*local_40 + 0x10) = in_stack_ffffffffffffff5c;
          if (1 < (int)uVar11) {
            local_40[(long)(int)uVar11 * 2 + 1] =
                 (long)in_stack_ffffffffffffff90 - local_d8 * (int)(uVar11 - 1);
          }
          local_38 = (transport_entry_conflict)INT_CMmalloc((size_t)in_stack_fffffffffffffeb0);
          memcpy(local_38,local_40,(long)(int)(uVar11 + 2) << 4);
          for (local_90 = 0; local_90 < (int)uVar11; local_90 = local_90 + 1) {
          }
          in_stack_fffffffffffffeb8 = (CMConnection)INT_CMmalloc((size_t)in_stack_fffffffffffffeb0);
          in_stack_fffffffffffffeb8->trans = local_38;
          if ((local_1c == local_7c - 1) || (iVar9 == 0)) {
            *(long **)&in_stack_fffffffffffffeb8->conn_ref_count = local_40;
            *(uint *)&in_stack_fffffffffffffeb8->transport_data = uVar11;
          }
          else {
            *(undefined8 *)&in_stack_fffffffffffffeb8->conn_ref_count = 0;
          }
          in_stack_fffffffffffffeb0 = write_is_done;
          iVar2 = INT_CMwrite_raw_notify
                            (conn_00,(FFSEncodeVector)in_stack_fffffffffffffeb8,
                             (FFSEncodeVector)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(long)__s
                             ,in_stack_ffffffffffffff48,(attr_list)in_stack_ffffffffffffff40,iVar9,
                             (CMcompletion_notify_func)CONCAT44(uVar11,uVar10),
                             in_stack_ffffffffffffff90);
          local_30 = (long)iVar2;
          if ((local_1c == local_7c - 1) || (iVar9 == 0)) {
            local_40 = (long *)0x0;
          }
          if (local_30 != 1) {
            free(local_40);
            return (attr_list)0x0;
          }
          if ((int)local_10[0x24] != 0) {
            wait_for_pending_write(in_stack_ffffffffffffff40);
          }
        }
        local_64 = 0xfc000000;
        local_60 = 0x18;
        if (local_40 == (long *)0x0) {
          local_40 = (long *)INT_CMmalloc((size_t)in_stack_fffffffffffffeb0);
        }
        *local_40 = (long)&local_68;
        local_40[1] = 0x18;
        iVar9 = INT_CMwrite_raw(in_stack_fffffffffffffee0,(FFSEncodeVector)in_stack_fffffffffffffed8
                                ,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                (size_t)in_stack_fffffffffffffec0,
                                (attr_list)in_stack_fffffffffffffeb8,(int)in_stack_fffffffffffffef0)
        ;
        iVar2 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
        local_30 = (long)iVar9;
        free(local_40);
        free(local_48);
        if (local_30 == 1) {
          local_e0 = INT_CMCondition_wait(in_stack_fffffffffffffed8,iVar2);
          if (local_e0 == 0) {
            lVar6._0_4_ = conn_00->write_pending;
            lVar6._4_4_ = conn_00->do_non_blocking_write;
            iVar9 = CMtrace_val[5];
            if (lVar6 == 0) {
              iVar9 = CMtrace_init(in_stack_fffffffffffffef0,trace_type);
            }
            if (iVar9 != 0) {
              if (CMtrace_PID != 0) {
                pFVar8 = *(FILE **)&conn_00->write_pending;
                _Var3 = getpid();
                lVar6 = (long)_Var3;
                pVar7 = pthread_self();
                fprintf(pFVar8,"P%lxT%lx - ",lVar6,pVar7);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_100);
                fprintf(*(FILE **)&conn_00->write_pending,"%lld.%.9ld - ",local_100.tv_sec,
                        local_100.tv_nsec);
              }
              fprintf(*(FILE **)&conn_00->write_pending,
                      "CM - Completed transport test CONNECTION FAILED- result %p \n",local_28);
            }
            fflush(*(FILE **)&conn_00->write_pending);
          }
          else {
            lVar1._0_4_ = conn_00->write_pending;
            lVar1._4_4_ = conn_00->do_non_blocking_write;
            iVar9 = CMtrace_val[5];
            if (lVar1 == 0) {
              iVar9 = CMtrace_init(in_stack_fffffffffffffef0,trace_type);
            }
            if (iVar9 != 0) {
              if (CMtrace_PID != 0) {
                pFVar8 = *(FILE **)&conn_00->write_pending;
                _Var3 = getpid();
                lVar6 = (long)_Var3;
                pVar7 = pthread_self();
                fprintf(pFVar8,"P%lxT%lx - ",lVar6,pVar7);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_f0);
                fprintf(*(FILE **)&conn_00->write_pending,"%lld.%.9ld - ",local_f0.tv_sec,
                        local_f0.tv_nsec);
              }
              fprintf(*(FILE **)&conn_00->write_pending,
                      "CM - Completed transport test - result %p \n",local_28);
            }
            fflush(*(FILE **)&conn_00->write_pending);
          }
          local_8 = local_28;
        }
        else {
          local_8 = (attr_list)0x0;
        }
      }
      else {
        free(local_48);
        local_8 = (attr_list)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

extern attr_list
INT_CMtest_transport(CMConnection conn, attr_list how)
{
    int i;
    int cond;
    attr_list result = NULL;
    long actual;
    struct FFSEncodeVec *write_vec;
    struct FFSEncodeVec *tmp_vec, *header_vec;
    int header[6];
    ssize_t size;
    int vecs = 1;
    int verbose = 0;
    int repeat_count = 1;
    int reuse_write_buffer = 1;
    long start_size, count;
    init_atoms();
    cond = INT_CMCondition_get(conn->cm, conn);
    CManager cm = conn->cm;
    struct _free_struct *write_data;
    int node_id;

    if (!get_long_attr(how, CM_TRANS_TEST_SIZE, &size)) {
	printf("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required\n");
	return 0;
    }
    get_int_attr(how, CM_TRANS_TEST_VECS, &vecs);
    if (vecs < 1) {
	printf("Stupid vecs value in CMtest_transport, %d\n", vecs);
	return 0;
    }
    if (((float)size / (float) vecs) < 24.0) {
      vecs = 1;
      if (size < 24) {
	size = 24;
      }
    }
    get_int_attr(how, CM_TRANS_TEST_VERBOSE, &verbose);
    get_int_attr(how, CM_TRANS_TEST_REPEAT, &repeat_count);
    get_int_attr(how, CM_TRANS_TEST_REUSE_WRITE_BUFFER, &reuse_write_buffer);
    get_int_attr(how, CM_TRANS_TEST_NODE, &node_id);
    char *attr_str = attr_list_to_string(how);

    
    start_size = (int)strlen(attr_str) + (int)sizeof(header) + 1;
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)header)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)header)[1] = (CMPerfTestInit<<24);
#else
    ((int*)header)[1] = ((start_size >> 32) &0xffffff) | (CMPerfTestInit<<24);
#endif
    ((int*)header)[2] = (start_size & 0xffffffff);
    ((int*)header)[3] = cond;   /* condition value in third entry */
    ((int*)header)[4] = sizeof(header);   /* header size 4th entry */
    ((int*)header)[5] = 0;
    INT_CMCondition_set_client_data( conn->cm, cond, &result);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating transport test of %zd bytes, %d messages\n", size, repeat_count);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - transport test, sending first message\n");

    header_vec = malloc(sizeof(header_vec[0]) * (vecs + 1));  /* at least 2 */
    header_vec[0].iov_base = &header[0];
    header_vec[0].iov_len = sizeof(header);
    header_vec[1].iov_base = attr_str;
    header_vec[1].iov_len = strlen(attr_str) + 1; /* send NULL */
    actual = INT_CMwrite_raw(conn, header_vec, NULL, 2, header_vec[0].iov_len + header_vec[1].iov_len, NULL, 1);
    free(attr_str);
    if (actual != 1) { 
	free(header_vec);
	return NULL;
    }

    tmp_vec = NULL;
    size_t each = (size + vecs - 1) / vecs;
    for (i=0; i <repeat_count; i++) {
	if (tmp_vec == NULL) {
	    tmp_vec = malloc(sizeof(tmp_vec[0]) * (vecs + 2));  /* at least 2 */
	    tmp_vec[0].iov_len = 5 * sizeof(int); /* body header */
	    for (count = 0; count < vecs; count++) {
		tmp_vec[count+1].iov_base = calloc(each + repeat_count, 1);
		tmp_vec[count+1].iov_len = each;
	    }
	    for (count = 0; count < vecs; count++) {
		/* for each vector, give it unique data */
		int j;
		for (j=0; j < ((each + repeat_count) /sizeof(int)); j++) {
		    ((int*)tmp_vec[count+1].iov_base)[j] = rand();
		}
	    }
	    if (tmp_vec[1].iov_len > tmp_vec[0].iov_len) {
	      tmp_vec[1].iov_len -= tmp_vec[0].iov_len;
	    } else {
	      tmp_vec[1].iov_len = 1;  /* just so there's something */
	    }
	}
	tmp_vec[0].iov_base = malloc(5 * sizeof(int)); /* body header */
	((int*)tmp_vec[0].iov_base)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
	((int*)tmp_vec[0].iov_base)[1] = (CMPerfTestBody<<24);
#else
	((int*)tmp_vec[0].iov_base)[1] = ((size >> 32) &0xffffff) | (CMPerfTestBody<<24);
#endif
	((int*)tmp_vec[0].iov_base)[2] = (size & 0xffffffff);
	((int*)tmp_vec[0].iov_base)[3] = i;   /* sequence number */
	((int*)tmp_vec[0].iov_base)[4] = node_id;   /* node_id */
	if (vecs > 1) {
	    /* if more than one vec, handle rounding */
	    tmp_vec[vecs].iov_len = size - (each * (vecs-1));
	}
	write_vec = malloc(sizeof(write_vec[0]) * (vecs + 2));  /* at least 3 */
	memcpy(write_vec, tmp_vec, sizeof(write_vec[0]) * (vecs + 2));
	for (count = 0; count < vecs; count++) {
	    /* On each iteration, increment the write base for each buffer by 1 */
//	    write_vec[count+1].iov_base += i;
	}
	write_data = malloc(sizeof(struct _free_struct));
	write_data->write_vec = write_vec;
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    write_data->tmp_vec = tmp_vec;
	    write_data->vecs = vecs;
	} else {
	    write_data->tmp_vec = NULL;
	}
	actual = INT_CMwrite_raw_notify(conn, write_vec, NULL, vecs+1, size, 
					NULL, 0, write_is_done, (void*)write_data);
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    tmp_vec = NULL;
	}

	if (actual != 1) {
	    free(tmp_vec);
	    return NULL;
	}
	if (conn->write_pending) {
	    wait_for_pending_write(conn);
	}
    }
    ((int*)header)[1] = 0 | (CMPerfTestEnd<<24);
    ((int*)header)[2] = sizeof(header);
    if (!tmp_vec) tmp_vec = malloc(sizeof(tmp_vec[0]));
    tmp_vec[0].iov_base = &header[0];
    tmp_vec[0].iov_len = sizeof(header);
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, sizeof(header), NULL, 0);
    free(tmp_vec);
    free(header_vec);
    if (actual != 1) {
	return NULL;
    }

    int ret = INT_CMCondition_wait(conn->cm, cond);
    if (ret) {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test - result %p \n", result);
    } else {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test CONNECTION FAILED- result %p \n", result);
    }
    return result;
}